

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O1

void __thiscall cmQtAutoGenerators::cmQtAutoGenerators(cmQtAutoGenerators *this)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  char *pcVar3;
  string colorEnv;
  string local_68;
  
  (this->QtMajorVersion)._M_dataplus._M_p = (pointer)&(this->QtMajorVersion).field_2;
  (this->QtMajorVersion)._M_string_length = 0;
  (this->QtMajorVersion).field_2._M_local_buf[0] = '\0';
  (this->Sources)._M_dataplus._M_p = (pointer)&(this->Sources).field_2;
  (this->Sources)._M_string_length = 0;
  (this->Sources).field_2._M_local_buf[0] = '\0';
  (this->RccSources).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->RccSources).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->RccSources).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->SkipMoc)._M_dataplus._M_p = (pointer)&(this->SkipMoc).field_2;
  (this->SkipMoc)._M_string_length = 0;
  (this->SkipMoc).field_2._M_local_buf[0] = '\0';
  (this->SkipUic)._M_dataplus._M_p = (pointer)&(this->SkipUic).field_2;
  (this->SkipUic)._M_string_length = 0;
  (this->SkipUic).field_2._M_local_buf[0] = '\0';
  (this->Headers)._M_dataplus._M_p = (pointer)&(this->Headers).field_2;
  (this->Headers)._M_string_length = 0;
  (this->Headers).field_2._M_local_buf[0] = '\0';
  (this->Srcdir)._M_dataplus._M_p = (pointer)&(this->Srcdir).field_2;
  (this->Srcdir)._M_string_length = 0;
  (this->Srcdir).field_2._M_local_buf[0] = '\0';
  (this->Builddir)._M_dataplus._M_p = (pointer)&(this->Builddir).field_2;
  (this->Builddir)._M_string_length = 0;
  (this->Builddir).field_2._M_local_buf[0] = '\0';
  (this->MocExecutable)._M_dataplus._M_p = (pointer)&(this->MocExecutable).field_2;
  (this->MocExecutable)._M_string_length = 0;
  (this->MocExecutable).field_2._M_local_buf[0] = '\0';
  (this->UicExecutable)._M_dataplus._M_p = (pointer)&(this->UicExecutable).field_2;
  (this->UicExecutable)._M_string_length = 0;
  (this->UicExecutable).field_2._M_local_buf[0] = '\0';
  (this->RccExecutable)._M_dataplus._M_p = (pointer)&(this->RccExecutable).field_2;
  (this->RccExecutable)._M_string_length = 0;
  (this->RccExecutable).field_2._M_local_buf[0] = '\0';
  (this->MocCompileDefinitionsStr)._M_dataplus._M_p =
       (pointer)&(this->MocCompileDefinitionsStr).field_2;
  (this->MocCompileDefinitionsStr)._M_string_length = 0;
  (this->MocCompileDefinitionsStr).field_2._M_local_buf[0] = '\0';
  (this->MocIncludesStr)._M_dataplus._M_p = (pointer)&(this->MocIncludesStr).field_2;
  (this->MocIncludesStr)._M_string_length = 0;
  (this->MocIncludesStr).field_2._M_local_buf[0] = '\0';
  (this->MocOptionsStr)._M_dataplus._M_p = (pointer)&(this->MocOptionsStr).field_2;
  (this->MocOptionsStr)._M_string_length = 0;
  (this->MocOptionsStr).field_2._M_local_buf[0] = '\0';
  (this->ProjectBinaryDir)._M_dataplus._M_p = (pointer)&(this->ProjectBinaryDir).field_2;
  (this->ProjectBinaryDir)._M_string_length = 0;
  (this->ProjectBinaryDir).field_2._M_local_buf[0] = '\0';
  (this->ProjectSourceDir)._M_dataplus._M_p = (pointer)&(this->ProjectSourceDir).field_2;
  (this->ProjectSourceDir)._M_string_length = 0;
  (this->ProjectSourceDir).field_2._M_local_buf[0] = '\0';
  (this->TargetName)._M_dataplus._M_p = (pointer)&(this->TargetName).field_2;
  (this->TargetName)._M_string_length = 0;
  (this->TargetName).field_2._M_local_buf[0] = '\0';
  (this->OriginTargetName)._M_dataplus._M_p = (pointer)&(this->OriginTargetName).field_2;
  (this->OriginTargetName)._M_string_length = 0;
  (this->OriginTargetName).field_2._M_local_buf[0] = '\0';
  (this->CurrentCompileSettingsStr)._M_dataplus._M_p =
       (pointer)&(this->CurrentCompileSettingsStr).field_2;
  (this->CurrentCompileSettingsStr)._M_string_length = 0;
  (this->CurrentCompileSettingsStr).field_2._M_local_buf[0] = '\0';
  (this->OldCompileSettingsStr)._M_dataplus._M_p = (pointer)&(this->OldCompileSettingsStr).field_2;
  (this->OldCompileSettingsStr)._M_string_length = 0;
  (this->OldCompileSettingsStr).field_2._M_local_buf[0] = '\0';
  (this->OutMocCppFilename)._M_dataplus._M_p = (pointer)&(this->OutMocCppFilename).field_2;
  (this->OutMocCppFilename)._M_string_length = 0;
  (this->OutMocCppFilename).field_2._M_local_buf[0] = '\0';
  (this->MocIncludes).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->MocIncludes;
  (this->MocIncludes).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->MocIncludes;
  (this->MocIncludes).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  (this->MocDefinitions).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->MocDefinitions;
  (this->MocDefinitions).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->MocDefinitions;
  (this->UicOptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->UicOptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->MocDefinitions).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  (this->MocOptions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->MocOptions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->MocOptions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->UicTargetOptions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->UicTargetOptions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->UicTargetOptions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->UicOptions)._M_t._M_impl.super__Rb_tree_header;
  (this->UicOptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->UicOptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->UicOptions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->RccOptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->RccOptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->RccOptions)._M_t._M_impl.super__Rb_tree_header;
  (this->RccOptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->RccOptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->RccOptions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->RccInputs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->RccInputs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->RccInputs)._M_t._M_impl.super__Rb_tree_header;
  (this->RccInputs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->RccInputs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->RccInputs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pcVar3 = cmsys::SystemTools::GetEnv("VERBOSE");
  this->Verbose = pcVar3 != (char *)0x0;
  this->ColorOutput = true;
  this->RunMocFailed = false;
  this->RunUicFailed = false;
  this->RunRccFailed = false;
  this->GenerateAll = false;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"");
  cmsys::SystemTools::GetEnv("COLOR",&local_68);
  if (local_68._M_string_length != 0) {
    bVar2 = cmSystemTools::IsOn(local_68._M_dataplus._M_p);
    this->ColorOutput = bVar2;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

cmQtAutoGenerators::cmQtAutoGenerators()
:Verbose(cmsys::SystemTools::GetEnv("VERBOSE") != 0)
,ColorOutput(true)
,RunMocFailed(false)
,RunUicFailed(false)
,RunRccFailed(false)
,GenerateAll(false)
{

  std::string colorEnv = "";
  cmsys::SystemTools::GetEnv("COLOR", colorEnv);
  if(!colorEnv.empty())
    {
    if(cmSystemTools::IsOn(colorEnv.c_str()))
      {
      this->ColorOutput = true;
      }
    else
      {
      this->ColorOutput = false;
      }
    }
}